

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall google::protobuf::compiler::python::Generator::PrintServices(Generator *this)

{
  int i;
  long lVar1;
  long lVar2;
  
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < *(int *)(this->file_ + 0x34); lVar1 = lVar1 + 1) {
    PrintServiceClass(this,(ServiceDescriptor *)(*(long *)(this->file_ + 0x68) + lVar2));
    PrintServiceStub(this,(ServiceDescriptor *)(*(long *)(this->file_ + 0x68) + lVar2));
    io::Printer::Print<>(this->printer_,"\n");
    lVar2 = lVar2 + 0x30;
  }
  return;
}

Assistant:

void Generator::PrintServices() const {
  for (int i = 0; i < file_->service_count(); ++i) {
    PrintServiceClass(*file_->service(i));
    PrintServiceStub(*file_->service(i));
    printer_->Print("\n");
  }
}